

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

void __thiscall NetworkDisable::NetworkDisable(NetworkDisable *this,CConnman *connman)

{
  long lVar1;
  bool bVar2;
  undefined8 uVar3;
  CConnman *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  CConnman *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  bool in_stack_ffffffffffffffef;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->_M_dataplus)._M_p = (pointer)in_RSI;
  CConnman::SetNetworkActive(in_RSI,in_stack_ffffffffffffffef);
  bVar2 = CConnman::GetNetworkActive(in_stack_ffffffffffffff88);
  if (bVar2) {
    uVar3 = __cxa_allocate_exception(0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               in_stack_ffffffffffffffd0,(allocator<char> *)in_RDI);
    JSONRPCError(in_stack_ffffffffffffffdc,in_RDI);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar3,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

NetworkDisable(CConnman& connman) : m_connman(connman) {
        m_connman.SetNetworkActive(false);
        if (m_connman.GetNetworkActive()) {
            throw JSONRPCError(RPC_MISC_ERROR, "Network activity could not be suspended.");
        }
    }